

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * parse_boolean_value(char **string)

{
  int iVar1;
  size_t false_token_size;
  size_t true_token_size;
  char **string_local;
  
  iVar1 = strncmp("true",*string,4);
  if (iVar1 == 0) {
    *string = *string + 4;
    string_local = (char **)json_value_init_boolean(1);
  }
  else {
    iVar1 = strncmp("false",*string,5);
    if (iVar1 == 0) {
      *string = *string + 5;
      string_local = (char **)json_value_init_boolean(0);
    }
    else {
      string_local = (char **)0x0;
    }
  }
  return (JSON_Value *)string_local;
}

Assistant:

static JSON_Value * parse_boolean_value(const char **string) {
    size_t true_token_size = SIZEOF_TOKEN("true");
    size_t false_token_size = SIZEOF_TOKEN("false");
    if (strncmp("true", *string, true_token_size) == 0) {
        *string += true_token_size;
        return json_value_init_boolean(1);
    } else if (strncmp("false", *string, false_token_size) == 0) {
        *string += false_token_size;
        return json_value_init_boolean(0);
    }
    return NULL;
}